

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O0

int __thiscall PGSStreamReader::readObjectDef(PGSStreamReader *this,uint8_t *pos,uint8_t *end)

{
  ushort uVar1;
  uint16_t uVar2;
  ostream *poVar3;
  VodCoreException *this_00;
  uint8_t *buffer;
  size_type __n;
  reference __dest;
  mapped_type_conflict1 *pmVar4;
  int minY;
  undefined1 local_218 [8];
  BitmapInfo bmpRef;
  BitmapInfo bmpDest;
  size_t oldSize;
  string local_1e8;
  ostringstream local_1b8 [8];
  ostringstream ss;
  key_type_conflict4 local_3a;
  uint8_t *puStack_38;
  uint16_t object_id;
  uint8_t *objEnd;
  uint8_t *puStack_28;
  uint32_t objectSize;
  uint8_t *end_local;
  uint8_t *pos_local;
  PGSStreamReader *this_local;
  
  end_local = pos + 4;
  puStack_28 = end;
  pos_local = (uint8_t *)this;
  objEnd._4_4_ = AV_RB24(end_local);
  end_local = end_local + 3;
  puStack_38 = end_local + objEnd._4_4_;
  if ((this->super_AbstractStreamReader).m_bufEnd < puStack_38) {
    this_local._4_4_ = 1;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_dstRle);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&this->m_dstRle,(ulong)objEnd._4_4_);
    uVar2 = AV_RB16(end_local);
    this->object_width = uVar2;
    end_local = end_local + 2;
    uVar2 = AV_RB16(end_local);
    this->object_height = uVar2;
    local_3a = 0;
    end_local = end_local + 2;
    while (end_local < puStack_38) {
      if (puStack_28 <= end_local) {
        if (*end_local != '\x15') {
          std::__cxx11::ostringstream::ostringstream(local_1b8);
          poVar3 = std::operator<<((ostream *)local_1b8,"Unexpected byte ");
          poVar3 = std::operator<<(poVar3,*end_local);
          std::operator<<(poVar3," during parsing Object definition segment");
          this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          VodCoreException::VodCoreException(this_00,3,&local_1e8);
          __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        buffer = end_local + 1;
        end_local = buffer;
        uVar2 = AV_RB16(buffer);
        puStack_28 = buffer + (int)(uint)uVar2;
        end_local = end_local + 2;
        local_3a = AV_RB16(end_local);
        end_local = end_local + 4;
      }
      __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_dstRle);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_dstRle,(size_type)(puStack_28 + (__n - (long)end_local)));
      __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_dstRle,__n);
      memcpy(__dest,end_local,(long)puStack_28 - (long)end_local);
      end_local = puStack_28;
    }
    if ((this->m_needRescale & 1U) != 0) {
      pmVar4 = std::
               map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
               ::operator[](&this->composition_object_horizontal_position,&local_3a);
      uVar1 = *pmVar4;
      pmVar4 = std::
               map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
               ::operator[](&this->composition_object_vertical_position,&local_3a);
      decodeRleData(this,(uint)uVar1,(uint)*pmVar4);
      minY = 0;
      if (this->m_fontBorder != 0) {
        minY = 0x21;
      }
      yuvToRgb(this,minY);
      bmpRef._0_8_ = this->m_rgbBuffer;
      local_218._0_4_ = ZEXT24(this->m_video_width);
      local_218._4_4_ = ZEXT24(this->m_video_height);
      bmpRef.buffer._0_4_ = (uint)this->m_scaled_width;
      bmpRef.buffer._4_4_ = (uint)this->m_scaled_height;
      rescaleRGB((BitmapInfo *)&bmpRef.buffer,(BitmapInfo *)local_218);
      if (this->m_fontBorder != 0) {
        text_subtitles::TextSubtitlesRender::addBorder
                  (this->m_fontBorder,this->m_scaledRgbBuffer,(uint)this->m_scaled_width,
                   (uint)this->m_scaled_height);
      }
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int PGSStreamReader::readObjectDef(const uint8_t* pos, const uint8_t* end)
{
    pos += 4;  // skip object ID and version number
    const uint32_t objectSize = AV_RB24(pos);
    pos += 3;
    const uint8_t* objEnd = pos + objectSize;

    if (m_bufEnd < objEnd)
        return NEED_MORE_DATA;

    m_dstRle.clear();
    m_dstRle.reserve(objectSize);

    object_width = AV_RB16(pos);
    pos += 2;
    object_height = AV_RB16(pos);
    pos += 2;
    uint16_t object_id = 0;
    while (pos < objEnd)
    {
        if (pos >= end)
        {
            if (*pos != OBJECT_DEF_SEGMENT)
                THROW(ERR_COMMON, "Unexpected byte " << *pos << " during parsing Object definition segment")
            pos++;  // skip OBJECT_DEF_SEGMENT
            end = pos + AV_RB16(pos);
            pos += 2;
            object_id = AV_RB16(pos);
            pos += 4;  // skip object ID and version number
        }
        const size_t oldSize = m_dstRle.size();
        m_dstRle.resize(oldSize + end - pos);
        memcpy(&m_dstRle[oldSize], pos, end - pos);
        pos += end - pos;
    }
    if (m_needRescale)
    {
        decodeRleData(composition_object_horizontal_position[object_id],
                      composition_object_vertical_position[object_id]);
        yuvToRgb(m_fontBorder ? Y_THRESHOLD : 0);
        BitmapInfo bmpDest;
        BitmapInfo bmpRef;

        bmpRef.buffer = reinterpret_cast<RGBQUAD*>(m_rgbBuffer);
        bmpRef.Width = m_video_width;
        bmpRef.Height = m_video_height;
        bmpDest.buffer = reinterpret_cast<RGBQUAD*>(m_scaledRgbBuffer);
        bmpDest.Width = m_scaled_width;
        bmpDest.Height = m_scaled_height;

        rescaleRGB(&bmpDest, &bmpRef);
        if (m_fontBorder)
            TextSubtitlesRender::addBorder(m_fontBorder, m_scaledRgbBuffer, m_scaled_width, m_scaled_height);
        // memcpy(bmpDest.buffer, bmpRef.buffer, bmpDest.Width * bmpDest.Height * 4);
    }
    return 0;
}